

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

int __thiscall
CVmObjStringBuffer::set_index_val_q
          (CVmObjStringBuffer *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  int iVar1;
  short *psVar2;
  int iVar3;
  wchar_t ch;
  wchar_t local_2c;
  
  if (index_val->typ == VM_INT) {
    iVar1 = (index_val->val).intval;
  }
  else {
    iVar1 = vm_val_t::nonint_num_to_int(index_val);
  }
  iVar3 = -1;
  if (iVar1 < 0) {
    iVar3 = *(int *)(this->super_CVmObject).ext_;
  }
  iVar3 = iVar3 + iVar1;
  if ((iVar3 < 0) || (*(int *)(this->super_CVmObject).ext_ <= iVar3)) {
    err_throw(0x7df);
  }
  if (new_val->typ == VM_INT) {
LAB_002b325c:
    local_2c = (new_val->val).obj;
  }
  else {
    iVar1 = vm_val_t::nonint_is_numeric(new_val);
    if (iVar1 == 0) {
      psVar2 = (short *)vm_val_t::get_as_string(new_val);
      if (*psVar2 == 0) {
        local_2c = L'\0';
      }
      else {
        local_2c = utf8_ptr::s_getch((char *)(psVar2 + 1));
      }
      goto LAB_002b3268;
    }
    if (new_val->typ == VM_INT) goto LAB_002b325c;
    local_2c = vm_val_t::nonint_num_to_int(new_val);
  }
  if (0xffff < (uint)local_2c) {
    err_throw(0x902);
  }
LAB_002b3268:
  splice_text(this,self,iVar3,1,&local_2c,1,1);
  result->typ = VM_OBJ;
  (result->val).obj = self;
  return 1;
}

Assistant:

int CVmObjStringBuffer::set_index_val_q(VMG_ vm_val_t *result,
                                        vm_obj_id_t self,
                                        const vm_val_t *index_val,
                                        const vm_val_t *new_val)
{
    /* the index must be an integer */
    int32_t idx = index_val->num_to_int(vmg0_);

    /* adjust to zero-based indexing or a negative end-based index */
    idx += (idx < 0 ? get_ext()->len : -1);

    /* ensure idx is in range */
    if (idx < 0 || idx >= (int32_t)get_ext()->len)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* 
     *   If the new value is an integer, interpret it as a unicode character
     *   value to set at the given character.  Otherwise, cast it to a string
     *   and take its first character.  
     */
    wchar_t ch;
    if (new_val->is_numeric(vmg0_))
    {
        /* it's an integer - treat it as a unicode character value */
        int32_t ich = new_val->num_to_int(vmg0_);
        if (ich < 0 || ich > 65535)
            err_throw(VMERR_BAD_VAL_BIF);

        /* it's in range - cast to wchar_t */
        ch = (wchar_t)ich;
    }
    else
    {
        /* treat it as a string */
        const char *str = new_val->get_as_string(vmg0_);

        /* get the first character */
        utf8_ptr p((char *)str + VMB_LEN);
        ch = (vmb_get_len(str) > 0 ? p.getch() : 0);
    }

    /* splice the character at the desired index */
    splice_text(vmg_ self, (int)idx, 1, &ch, 1, TRUE);
    
    /* we change in place, so the result is 'self' */
    result->set_obj(self);

    /* handled */
    return TRUE;
}